

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

bool __thiscall ON_Xform::IsIdentity(ON_Xform *this,double zero_tolerance)

{
  double (*padVar1) [4];
  int local_2c;
  double *pdStack_28;
  int i;
  double *v;
  double zero_tolerance_local;
  ON_Xform *this_local;
  
  if ((zero_tolerance < 0.0) || (1.23432101234321e+308 <= zero_tolerance)) {
    this_local._7_1_ = false;
  }
  else {
    pdStack_28 = (double *)this;
    for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
      if (zero_tolerance < ABS(1.0 - *pdStack_28)) {
        return false;
      }
      if (zero_tolerance < ABS(pdStack_28[1])) {
        return false;
      }
      if (zero_tolerance < ABS(pdStack_28[2])) {
        return false;
      }
      padVar1 = (double (*) [4])(pdStack_28 + 4);
      if (zero_tolerance < ABS(pdStack_28[3])) {
        return false;
      }
      pdStack_28 = pdStack_28 + 5;
      if (zero_tolerance < ABS((*padVar1)[0])) {
        return false;
      }
    }
    if (ABS(1.0 - *pdStack_28) <= zero_tolerance) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Xform::IsIdentity( double zero_tolerance ) const
{
  // The code below will return false if m_xform[][] contains
  // a nan value.

  if (!(zero_tolerance >= 0.0 && zero_tolerance < ON_UNSET_POSITIVE_VALUE))
    return false;

  const double* v = &m_xform[0][0];
  for ( int i = 0; i < 3; i++ )
  {
    if ( !(fabs(1.0 - *v++) <= zero_tolerance) )
      return false;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return false;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return false;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return false;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return false;
  }
  if ( !(fabs( 1.0 - *v ) <= zero_tolerance) )
    return false;

  return true;
}